

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles2::Performance::InvalidShaderCompilerOperCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerOperCase *this,
          int measurementNdx)

{
  InvalidityType IVar1;
  size_type sVar2;
  uint uVar3;
  pointer pcVar4;
  ShaderValidity SVar5;
  char *op;
  ShaderValidity SVar6;
  size_type __dnew;
  string local_88;
  size_type local_68;
  ShaderValidity local_5c;
  string local_58;
  string *local_38;
  
  uVar3 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  uVar3 = uVar3 >> 0xf ^ (this->super_InvalidShaderCompilerCase).m_startHash ^ uVar3;
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  local_38 = (string *)&__return_storage_ptr__->fragShaderSource;
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  IVar1 = (this->super_InvalidShaderCompilerCase).m_invalidityType;
  SVar5 = IVar1 == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  SVar6 = SHADER_VALIDITY_INVALID_CHAR;
  if (IVar1 != INVALIDITY_INVALID_CHAR) {
    SVar6 = SVar5;
  }
  if (this->m_isVertexCase == true) {
    binaryOpVertexTemplate_abi_cxx11_
              (&local_88,(Performance *)(ulong)(uint)this->m_numOperations,
               (int)(this->m_oper)._M_dataplus._M_p,(char *)(ulong)SVar5);
    specializeShaderSource(&local_58,&local_88,uVar3,SVar6);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_68 = 0x8d;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar4 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    sVar2 = local_68;
    local_88.field_2._M_allocated_capacity = local_68;
    local_88._M_dataplus._M_p = pcVar4;
    memcpy(pcVar4,
           "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
           ,0x8d);
    local_88._M_string_length = sVar2;
    pcVar4[sVar2] = '\0';
    specializeShaderSource(&local_58,&local_88,uVar3,SVar6);
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_68 = 0x122;
    local_5c = SVar6;
    pcVar4 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    sVar2 = local_68;
    local_88.field_2._M_allocated_capacity = local_68;
    local_88._M_dataplus._M_p = pcVar4;
    memcpy(pcVar4,
           "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec4 a_value${NAME_SPEC};\nvarying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
           ,0x122);
    SVar6 = local_5c;
    local_88._M_string_length = sVar2;
    pcVar4[sVar2] = '\0';
    op = (char *)(ulong)local_5c;
    specializeShaderSource(&local_58,&local_88,uVar3,local_5c);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    binaryOpFragmentTemplate_abi_cxx11_
              (&local_88,(Performance *)(ulong)(uint)this->m_numOperations,
               (int)(this->m_oper)._M_dataplus._M_p,op);
    specializeShaderSource(&local_58,&local_88,uVar3,SVar6);
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerOperCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	if (m_isVertexCase)
	{
		result.vertShaderSource = specializeShaderSource(binaryOpVertexTemplate(m_numOperations, m_oper.c_str()), specID, shaderValidity);
		result.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);
	}
	else
	{
		result.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		result.fragShaderSource = specializeShaderSource(binaryOpFragmentTemplate(m_numOperations, m_oper.c_str()), specID, shaderValidity);
	}

	return result;
}